

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree.c
# Opt level: O0

void test_read_format_mtree_nonexistent_contents_file(void)

{
  int iVar1;
  mode_t mVar2;
  archive *a_00;
  char *pcVar3;
  size_t sVar4;
  archive *a;
  archive_entry *ae;
  
  a_00 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'̄',(uint)(a_00 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̆',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̈',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a_00);
  iVar1 = archive_read_set_options(a_00,"mtree:checkfs");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̊',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_options(a, \"mtree:checkfs\")",a_00);
  iVar1 = archive_read_open_memory
                    (a_00,test_read_format_mtree_nonexistent_contents_file::archive,0x2e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̌',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open_memory(a, archive, sizeof(archive))",a_00);
  iVar1 = archive_read_next_header(a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̍',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                      a_00);
  pcVar3 = archive_error_string(a_00);
  sVar4 = strlen(pcVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'̎',(uint)(sVar4 != 0),"strlen(archive_error_string(a)) > 0",(void *)0x0);
  pcVar3 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'̏',pcVar3,"archive_entry_pathname(ae)","a","\"a\"",(void *)0x0,L'\0');
  mVar2 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̐',(ulong)mVar2,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",(void *)0x0
                     );
  iVar1 = archive_read_next_header(a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̒',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_file_count(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̓',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̔',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'̕',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_nonexistent_contents_file)
{
	static char archive[] =
	    "#mtree\n"
	    "a type=file contents=nonexistent_file\n";
	struct archive_entry *ae;
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assert(strlen(archive_error_string(a)) > 0);
	assertEqualString(archive_entry_pathname(ae), "a");
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}